

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-dgram-too-big.c
# Opt level: O1

int run_test_udp_dgram_too_big(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_udp_send_t *loop;
  uv_loop_t *loop_00;
  int iVar2;
  sockaddr_in addr;
  char dgram [65536];
  uv_buf_t uStack_10028;
  sockaddr_in sStack_10018;
  char acStack_10008 [65536];
  
  memset(acStack_10008,0x2a,0x10000);
  loop = (uv_udp_send_t *)uv_default_loop();
  iVar2 = 0x568340;
  iVar1 = uv_udp_init((uv_loop_t *)loop,&handle_);
  if (iVar1 == 0) {
    uStack_10028 = uv_buf_init(acStack_10008,0x10000);
    loop = (uv_udp_send_t *)0x1b4e3a;
    iVar2 = 0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_10018);
    if (iVar1 != 0) goto LAB_00184e55;
    loop = &req_;
    iVar2 = 0x568340;
    iVar1 = uv_udp_send(&req_,&handle_,&uStack_10028,1,(sockaddr *)&sStack_10018,send_cb);
    if (iVar1 != 0) goto LAB_00184e5a;
    if (close_cb_called != 0) goto LAB_00184e5f;
    if (send_cb_called != 0) goto LAB_00184e64;
    loop = (uv_udp_send_t *)uv_default_loop();
    iVar2 = 0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_00184e69;
    if (close_cb_called != 1) goto LAB_00184e6e;
    loop_00 = uv_default_loop();
    uv_walk(loop_00,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run(loop_00,UV_RUN_DEFAULT);
    loop = (uv_udp_send_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_dgram_too_big_cold_1();
LAB_00184e55:
    run_test_udp_dgram_too_big_cold_2();
LAB_00184e5a:
    run_test_udp_dgram_too_big_cold_3();
LAB_00184e5f:
    run_test_udp_dgram_too_big_cold_4();
LAB_00184e64:
    run_test_udp_dgram_too_big_cold_5();
LAB_00184e69:
    run_test_udp_dgram_too_big_cold_6();
LAB_00184e6e:
    run_test_udp_dgram_too_big_cold_7();
  }
  run_test_udp_dgram_too_big_cold_8();
  if (loop == &req_) {
    if (req_.handle == &handle_) {
      if (iVar2 == -0x5a) {
        uv_close((uv_handle_t *)&handle_,close_cb);
        send_cb_called = send_cb_called + 1;
        return extraout_EAX;
      }
      goto LAB_00184ebf;
    }
  }
  else {
    send_cb_cold_1();
  }
  send_cb_cold_2();
LAB_00184ebf:
  send_cb_cold_3();
  if (loop == (uv_udp_send_t *)&handle_) {
    close_cb_called = close_cb_called + 1;
    return 0x568340;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(udp_dgram_too_big) {
  char dgram[65536]; /* 64K MTU is unlikely, even on localhost */
  struct sockaddr_in addr;
  uv_buf_t buf;
  int r;

  memset(dgram, 42, sizeof dgram); /* silence valgrind */

  r = uv_udp_init(uv_default_loop(), &handle_);
  ASSERT(r == 0);

  buf = uv_buf_init(dgram, sizeof dgram);
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_send(&req_,
                  &handle_,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}